

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O2

void __thiscall Assimp::ASE::Dummy::Dummy(Dummy *this)

{
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"DUMMY",&local_29);
  BaseNode::BaseNode(&this->super_BaseNode,Dummy,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

Dummy() AI_NO_EXCEPT
    : BaseNode  (BaseNode::Dummy, "DUMMY") {
        // empty
    }